

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# use_stock.cpp
# Opt level: O2

void class_instance_in_array(void)

{
  allocator local_17c;
  allocator local_17b;
  allocator local_17a;
  allocator local_179;
  string local_178;
  string local_158;
  string local_138;
  string local_118;
  Stock stocks [4];
  
  std::__cxx11::string::string((string *)&local_118,"Apple",&local_179);
  L10_2::Stock::Stock(stocks,&local_118,0x14,30.0);
  std::__cxx11::string::string((string *)&local_138,"Microsoft",&local_17a);
  L10_2::Stock::Stock(stocks + 1,&local_138,0x1e,50.0);
  std::__cxx11::string::string((string *)&local_158,"Google",&local_17b);
  L10_2::Stock::Stock(stocks + 2,&local_158,10,50.0);
  std::__cxx11::string::string((string *)&local_178,"Facebook",&local_17c);
  L10_2::Stock::Stock(stocks + 3,&local_178,0x1e,30.0);
  std::__cxx11::string::~string((string *)&local_178);
  std::__cxx11::string::~string((string *)&local_158);
  std::__cxx11::string::~string((string *)&local_138);
  std::__cxx11::string::~string((string *)&local_118);
  std::operator<<((ostream *)&std::cout,"Stocks current holding:\n");
}

Assistant:

void class_instance_in_array() {
    using namespace L10_2;
    const int SIZE = 4;
    //  数组初始化
    Stock stocks[SIZE] = {
            Stock("Apple", 20, 30),
            Stock("Microsoft", 30, 50),
            Stock("Google", 10, 50),
            Stock("Facebook", 30, 30)
    };
    std::cout << "Stocks current holding:\n";
    int n;
    for (n = 0; n < SIZE; n++) {
        stocks[n].show();
    }

    //  top 地址指向数组里第一个元素
    const Stock * top = &stocks[0];
    for(n = 1; n < SIZE; n++) {
        // top 本来就是一个地址，地址访问其实例方法使用 ->
//        top->show();
        //  compare 返回了一个 stock 引用，对其再取地址
        top = &top->compare(stocks[n]);
    }
    std::cout << "Top valuabe holding:\n",
    top->show();
}